

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O2

void __thiscall pybind11::buffer_info::buffer_info(buffer_info *this,Py_buffer *view,bool ownview)

{
  int iVar1;
  void *ptr;
  ssize_t itemsize;
  long *__first;
  undefined4 uVar2;
  undefined7 in_register_00000011;
  allocator_type local_be;
  allocator<char> local_bd;
  undefined4 local_bc;
  _Vector_base<long,_std::allocator<long>_> local_b8;
  _Vector_base<long,_std::allocator<long>_> local_98;
  _Vector_base<long,_std::allocator<long>_> local_80;
  _Vector_base<long,_std::allocator<long>_> local_68;
  string local_50;
  
  local_bc = (undefined4)CONCAT71(in_register_00000011,ownview);
  ptr = view->buf;
  itemsize = view->itemsize;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,view->format,&local_bd);
  iVar1 = view->ndim;
  detail::any_container<long>::any_container<long*,void>
            ((any_container<long> *)&local_80,view->shape,view->shape + iVar1);
  __first = view->strides;
  if (__first == (long *)0x0) {
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&local_98,view->shape,view->shape + view->ndim,
               &local_be);
    detail::c_strides((vector<long,_std::allocator<long>_> *)&local_b8,
                      (vector<long,_std::allocator<long>_> *)&local_98,view->itemsize);
  }
  else {
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&local_b8,__first,__first + view->ndim,
               (allocator_type *)&local_98);
  }
  local_68._M_impl.super__Vector_impl_data._M_start =
       local_b8._M_impl.super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       local_b8._M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_info(this,ptr,itemsize,&local_50,(long)iVar1,(any_container<long> *)&local_80,
              (any_container<long> *)&local_68,view->readonly != 0);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_b8);
  if (__first == (long *)0x0) {
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_98);
  }
  uVar2 = local_bc;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  this->m_view = view;
  this->ownview = SUB41(uVar2,0);
  return;
}

Assistant:

explicit buffer_info(Py_buffer *view, bool ownview = true)
    : buffer_info(view->buf, view->itemsize, view->format, view->ndim,
            {view->shape, view->shape + view->ndim},
            /* Though buffer::request() requests PyBUF_STRIDES, ctypes objects
             * ignore this flag and return a view with NULL strides.
             * When strides are NULL, build them manually.  */
            view->strides
            ? std::vector<ssize_t>(view->strides, view->strides + view->ndim)
            : detail::c_strides({view->shape, view->shape + view->ndim}, view->itemsize),
            view->readonly) {
        this->m_view = view;
        this->ownview = ownview;
    }